

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendDirection(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  string *in_RDI;
  optional<metaf::Direction> oVar2;
  optional<std::pair<metaf::Direction,_metaf::Direction>_> d_1;
  optional<metaf::Direction> d;
  string *in_stack_00000090;
  Direction *in_stack_ffffffffffffffb8;
  optional<metaf::Direction> *in_stack_ffffffffffffffc0;
  undefined4 local_30;
  bool local_1;
  
  oVar2 = Direction::fromCardinalString
                    (in_RDI,SUB81((ulong)in_RSI >> 0x38,0),SUB81((ulong)in_RSI >> 0x30,0));
  local_30 = CONCAT31(local_30._1_3_,
                      oVar2.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Direction>._M_engaged);
  bVar1 = std::optional<metaf::Direction>::has_value((optional<metaf::Direction> *)0x24402e);
  if (bVar1) {
    in_RDI[1]._M_string_length =
         (size_type)
         oVar2.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction>._M_payload;
    *(undefined4 *)&in_RDI[1].field_2 = local_30;
    if (*(int *)in_RDI == 0) {
      *(undefined4 *)in_RDI = 2;
    }
    *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = in_EDX;
    local_1 = true;
  }
  else {
    Direction::fromSectorString(in_stack_00000090);
    bVar1 = std::optional<std::pair<metaf::Direction,_metaf::Direction>_>::has_value
                      ((optional<std::pair<metaf::Direction,_metaf::Direction>_> *)0x244085);
    if (bVar1) {
      std::optional<std::pair<metaf::Direction,_metaf::Direction>_>::operator*
                ((optional<std::pair<metaf::Direction,_metaf::Direction>_> *)0x244095);
      std::get<0ul,metaf::Direction,metaf::Direction>
                ((pair<metaf::Direction,_metaf::Direction> *)0x24409d);
      std::optional<metaf::Direction>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::optional<std::pair<metaf::Direction,_metaf::Direction>_>::operator*
                ((optional<std::pair<metaf::Direction,_metaf::Direction>_> *)0x2440b7);
      std::get<1ul,metaf::Direction,metaf::Direction>
                ((pair<metaf::Direction,_metaf::Direction> *)0x2440bf);
      std::optional<metaf::Direction>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (*(int *)in_RDI == 0) {
        *(undefined4 *)in_RDI = 7;
      }
      *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = in_EDX;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool VisibilityGroup::appendDirection(const std::string & group, IncompleteText next) {
	if (const auto d = Direction::fromCardinalString(group); d.has_value()) {
		dir = d;
		if (visType == Type::PREVAILING) visType = Type::DIRECTIONAL;
		incompleteText = next;
		return true;
	}
	if (const auto d = Direction::fromSectorString(group); d.has_value()) {
		dirSecFrom = std::get<0>(*d);
		dirSecTo = std::get<1>(*d);
		if (visType == Type::PREVAILING) visType = Type::SECTOR;
		incompleteText = next;
		return true;
	}
	return false;
}